

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O2

bool tchecker::syncprod::operator==(state_t *s1,state_t *s2)

{
  bool bVar1;
  make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t> *a1;
  make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t> *a2;
  
  a1 = (make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t> *)
       intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>::
       operator*(&s1->_vloc);
  a2 = (make_array_t<unsigned_int,_4UL,_tchecker::vloc_base_t> *)
       intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>::
       operator*(&s2->_vloc);
  bVar1 = tchecker::operator==(a1,a2);
  return bVar1;
}

Assistant:

bool operator==(tchecker::syncprod::state_t const & s1, tchecker::syncprod::state_t const & s2)
{
  return (static_cast<tchecker::ts::state_t const &>(s1) == static_cast<tchecker::ts::state_t const &>(s2) &&
          s1.vloc() == s2.vloc());
}